

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_FeaturesWithoutEditions_Test::TestBody
          (ParseEditionsTest_FeaturesWithoutEditions_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParseEditionsTest_FeaturesWithoutEditions_Test *local_10;
  ParseEditionsTest_FeaturesWithoutEditions_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n        syntax = \"proto3\";\n        option features.field_presence = IMPLICIT;\n        message TestMessage {\n          string foo = 1 [\n            default = \"hello\",\n            features.field_presence = EXPLICIT\n          ];\n        }"
            );
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,
            "1:8: Features are only valid under editions.\n4:17: Features are only valid under editions.\n"
           );
  ParserTest::ExpectHasValidationErrors(&this->super_ParseEditionsTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, FeaturesWithoutEditions) {
  ExpectHasValidationErrors(
      R"schema(
        syntax = "proto3";
        option features.field_presence = IMPLICIT;
        message TestMessage {
          string foo = 1 [
            default = "hello",
            features.field_presence = EXPLICIT
          ];
        })schema",
      "1:8: Features are only valid under editions.\n"
      "4:17: Features are only valid under editions.\n");
}